

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::HttpSocket::_OpenRequest(HttpSocket *this,Request *req)

{
  int iVar1;
  
  if (this->_inProgress != false) {
    return false;
  }
  if (((req->useSSL != true) || ((this->super_TcpSocket)._sslctx != (void *)0x0)) &&
     (iVar1 = TcpSocket::open(&this->super_TcpSocket,(req->host)._M_dataplus._M_p,req->port),
     (char)iVar1 != '\0')) {
    this->_inProgress = true;
    Request::operator=(&this->_curRequest,req);
    this->_status = 0;
    return true;
  }
  return false;
}

Assistant:

bool HttpSocket::_OpenRequest(const Request& req)
{
    if(_inProgress)
    {
        traceprint("HttpSocket::_OpenRequest(): _inProgress == true, should not be called.");
        return false;
    }
    if(req.useSSL && !hasSSL())
    {
        traceprint("HttpSocket::_OpenRequest(): Is an SSL connection, but SSL was not inited, doing that now\n");
        if(!initSSL(NULL)) // FIXME: supply cert list?
        {
            traceprint("FAILED to init SSL\n");
            return false;
        }
    }
    if(!open(req.host.c_str(), req.port))
        return false;
    _inProgress = true;
    _curRequest = req;
    _status = 0;
    return true;
}